

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O2

int nga_test_internal(Integer *nbhandle)

{
  struct_armcihdl_t *psVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ga_armcihdl_t *nb_handle;
  struct_armcihdl_t *psVar5;
  struct_armcihdl_t *psVar6;
  ga_nbhdl_array_t *pgVar7;
  
  uVar2 = (uint)*nbhandle & 0xff;
  uVar3 = 0;
  if ((uint)*nbhandle >> 8 == ga_ihdl_array[uVar2].ga_nbtag) {
    pgVar7 = ga_ihdl_array + uVar2;
    psVar1 = pgVar7->ahandle;
    while (nb_handle = psVar1, nb_handle != (ga_armcihdl_t *)0x0) {
      iVar4 = ARMCI_Test(&nb_handle->handle);
      psVar1 = nb_handle->next;
      if (iVar4 == 0) {
        psVar5 = nb_handle->previous;
        if (psVar5 == (struct_armcihdl_t *)0x0) {
          pgVar7->ahandle = psVar1;
          if (psVar1 != (struct_armcihdl_t *)0x0) {
            psVar5 = (struct_armcihdl_t *)0x0;
            psVar6 = psVar1;
            goto LAB_0018f18b;
          }
        }
        else {
          psVar5->next = psVar1;
          psVar6 = nb_handle->next;
          if (psVar6 != (struct_armcihdl_t *)0x0) {
LAB_0018f18b:
            psVar6->previous = psVar5;
          }
        }
        nb_handle->active = 0;
        nb_handle->next = (struct_armcihdl_t *)0x0;
        nb_handle->previous = (struct_armcihdl_t *)0x0;
        ga_ihdl_array[uVar2].count = ga_ihdl_array[uVar2].count + -1;
      }
    }
    iVar4 = ga_ihdl_array[uVar2].count;
    if (iVar4 == 0) {
      pgVar7->ahandle = (ga_armcihdl_t *)0x0;
      ga_ihdl_array[uVar2].active = 0;
    }
    uVar3 = (uint)(0 < iVar4);
  }
  return uVar3;
}

Assistant:

int nga_test_internal(Integer *nbhandle)
{
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  int retval = 0;
  int tag = inbhandle->ga_nbtag;

  /* check if tags match. If they don't then this request was already completed
   * so the handle can be used for another GA non-blocking call. Just return in
   * this case */
  if (tag == ga_ihdl_array[index].ga_nbtag) {
    ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;
    /* Loop over linked list and test all remaining armci non-blocking calls */
    while(next) {
      int ret = ARMCI_Test(&next->handle);
      ga_armcihdl_t *tmp = next->next;
      if (ret == 0) {
        /* operation is completed so remove it from linked list */
        if (next->previous != NULL) {
          /* operation is not first element in list */
          next->previous->next = next->next;
          if (next->next != NULL) {
            next->next->previous = next->previous;
          }
        } else {
          /* operation is first element in list */
          ga_ihdl_array[index].ahandle = next->next;
          if (next->next != NULL) {
            next->next->previous = NULL;
          }
        }
        next->previous = NULL;
        next->next = NULL;
        next->active = 0;
        ga_ihdl_array[index].count--;
      }
      next = tmp;
    }
    if (ga_ihdl_array[index].count == 0) {
      ga_ihdl_array[index].ahandle = NULL;
      ga_ihdl_array[index].active = 0;
    }
    if (ga_ihdl_array[index].count > 0) retval = 1;
  }

  return(retval);
}